

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Reflection::GetOneofFieldDescriptor
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  Reflection *local_48;
  uint32_t field_number;
  FieldDescriptor *field;
  OneofDescriptor *oneof_descriptor_local;
  Message *message_local;
  Reflection *this_local;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    local_48 = (Reflection *)OneofDescriptor::field(oneof_descriptor,0);
    bVar1 = HasField(this,message,(FieldDescriptor *)local_48);
    if (!bVar1) {
      local_48 = (Reflection *)0x0;
    }
    this_local = local_48;
  }
  else {
    number = GetOneofCase(this,message,oneof_descriptor);
    if (number == 0) {
      this_local = (Reflection *)0x0;
    }
    else {
      this_local = (Reflection *)Descriptor::FindFieldByNumber(this->descriptor_,number);
    }
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* Reflection::GetOneofFieldDescriptor(
    const Message& message, const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    const FieldDescriptor* field = oneof_descriptor->field(0);
    return HasField(message, field) ? field : nullptr;
  }
  uint32_t field_number = GetOneofCase(message, oneof_descriptor);
  if (field_number == 0) {
    return nullptr;
  }
  return descriptor_->FindFieldByNumber(field_number);
}